

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockCallTest.cpp
# Opt level: O0

void mocksAreCountedAsChecksTestFunction_(void)

{
  MockSupport *pMVar1;
  SimpleString local_88;
  SimpleString local_78;
  SimpleString local_68;
  SimpleString local_58;
  SimpleString local_48;
  SimpleString local_38 [2];
  SimpleString local_18;
  
  SimpleString::SimpleString(&local_18,"");
  pMVar1 = mock(&local_18,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(local_38,"foo");
  (*pMVar1->_vptr_MockSupport[3])(pMVar1,local_38);
  SimpleString::~SimpleString(local_38);
  SimpleString::~SimpleString(&local_18);
  SimpleString::SimpleString(&local_48,"");
  pMVar1 = mock(&local_48,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_58,"bar");
  (*pMVar1->_vptr_MockSupport[5])(pMVar1,3,&local_58);
  SimpleString::~SimpleString(&local_58);
  SimpleString::~SimpleString(&local_48);
  SimpleString::SimpleString(&local_68,"");
  pMVar1 = mock(&local_68,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_78,"lazy");
  (*pMVar1->_vptr_MockSupport[4])(pMVar1,&local_78);
  SimpleString::~SimpleString(&local_78);
  SimpleString::~SimpleString(&local_68);
  SimpleString::SimpleString(&local_88,"");
  pMVar1 = mock(&local_88,(MockFailureReporter *)0x0);
  (*pMVar1->_vptr_MockSupport[0x27])();
  SimpleString::~SimpleString(&local_88);
  return;
}

Assistant:

static void mocksAreCountedAsChecksTestFunction_()
{
    mock().expectOneCall("foo");
    mock().expectNCalls(3, "bar");
    mock().expectNoCall("lazy");
    mock().clear();
}